

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O1

int banksia::coordinateStringToPos(char *str)

{
  int iVar1;
  
  iVar1 = (byte)*str + 0x15f + (uint)(byte)str[1] * -8;
  if (7 < (byte)(str[1] - 0x31U)) {
    iVar1 = -1;
  }
  if (7 < (byte)(*str + 0x9fU)) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coordinateStringToPos(const char* str) {
        auto colChr = str[0], rowChr = str[1];
        if (colChr >= 'a' && colChr <= 'h' && rowChr >= '1' && rowChr <= '8') {
            int col = colChr - 'a';
            int row = rowChr - '1';
            
            return (7 - row) * 8 + col;
        }
        return -1;
    }